

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

uint32_t simd::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
                  SIMDType simdType)

{
  uint32_t rowSize;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint simdWidth;
  uint8_t *imageY;
  bool bVar4;
  
  do {
    if (simdType == cpu_function) break;
    uVar3 = getSimdSize(simdType);
    if (uVar3 <= width) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (image,x,y,width,height);
      Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
      rowSize = image->_rowSize;
      if (rowSize == width) {
        uVar2 = height;
        uVar1 = 1;
        if (width < 0xffffffff / height) {
          uVar2 = 1;
          uVar1 = height;
        }
        height = uVar2;
        width = width * uVar1;
      }
      simdWidth = width / uVar3;
      imageY = image->_data + (ulong)x + (ulong)(y * rowSize);
      if (simdType == sse_function) {
        uVar3 = sse::Sum(rowSize,imageY,imageY + height * rowSize,simdWidth,uVar3 * simdWidth,
                         width % uVar3);
        return uVar3;
      }
      if (simdType != avx_function) {
        return 0;
      }
      uVar3 = avx::Sum(rowSize,imageY,imageY + height * rowSize,simdWidth,uVar3 * simdWidth,
                       width % uVar3);
      return uVar3;
    }
    bVar4 = simdType == avx_function;
    simdType = sse_function;
  } while (bVar4);
  uVar3 = Image_Function::Sum(image,x,y,width,height);
  return uVar3;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            #ifdef PENGUINV_AVX_SET
            if ( simdType == avx_function )
                return Sum( image, x, y, width, height, sse_function );
            #endif

            return Image_Function::Sum( image, x, y, width, height );
        }

        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        #ifdef PENGUINV_AVX_SET
        if ( simdType == avx_function )
            return avx::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif
        #ifdef PENGUINV_SSE_SET
        if ( simdType == sse_function )
            return sse::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif
        #ifdef PENGUINV_NEON_SET
        if (simdType == neon_function)
            return neon::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif

        return 0u;
    }